

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int xmlXPathContextSetCache(xmlXPathContextPtr ctxt,int active,int value,int options)

{
  xmlXPathContextCachePtr cache;
  int iVar1;
  
  iVar1 = -1;
  if (ctxt == (xmlXPathContextPtr)0x0) {
    return -1;
  }
  cache = (xmlXPathContextCachePtr)ctxt->cache;
  if (active == 0) {
    iVar1 = 0;
    if (cache == (xmlXPathContextCachePtr)0x0) {
      return 0;
    }
    xmlXPathFreeCache(cache);
LAB_001d2c0f:
    ctxt->cache = (void *)0x0;
  }
  else {
    if (cache == (xmlXPathContextCachePtr)0x0) {
      cache = (xmlXPathContextCachePtr)(*xmlMalloc)(0x40);
      if (cache == (xmlXPathContextCachePtr)0x0) {
        xmlXPathErrMemory((xmlXPathContextPtr)0x0,"creating object cache\n");
        goto LAB_001d2c0f;
      }
      cache->maxBoolean = 0;
      cache->maxNumber = 0;
      *(undefined8 *)&cache->maxMisc = 0;
      cache->miscObjs = (xmlPointerListPtr)0x0;
      cache->maxNodeset = 0;
      cache->maxString = 0;
      cache->booleanObjs = (xmlPointerListPtr)0x0;
      cache->numberObjs = (xmlPointerListPtr)0x0;
      cache->nodesetObjs = (xmlPointerListPtr)0x0;
      cache->stringObjs = (xmlPointerListPtr)0x0;
      cache->maxNodeset = 100;
      cache->maxString = 100;
      cache->maxBoolean = 100;
      cache->maxNumber = 100;
      cache->maxMisc = 100;
      ctxt->cache = cache;
    }
    iVar1 = 0;
    if (options == 0) {
      iVar1 = 100;
      if (-1 < value) {
        iVar1 = value;
      }
      cache->maxNodeset = iVar1;
      cache->maxString = iVar1;
      cache->maxBoolean = iVar1;
      cache->maxNumber = iVar1;
      cache->maxMisc = iVar1;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int
xmlXPathContextSetCache(xmlXPathContextPtr ctxt,
			int active,
			int value,
			int options)
{
    if (ctxt == NULL)
	return(-1);
    if (active) {
	xmlXPathContextCachePtr cache;

	if (ctxt->cache == NULL) {
	    ctxt->cache = xmlXPathNewCache();
	    if (ctxt->cache == NULL)
		return(-1);
	}
	cache = (xmlXPathContextCachePtr) ctxt->cache;
	if (options == 0) {
	    if (value < 0)
		value = 100;
	    cache->maxNodeset = value;
	    cache->maxString = value;
	    cache->maxNumber = value;
	    cache->maxBoolean = value;
	    cache->maxMisc = value;
	}
    } else if (ctxt->cache != NULL) {
	xmlXPathFreeCache((xmlXPathContextCachePtr) ctxt->cache);
	ctxt->cache = NULL;
    }
    return(0);
}